

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O2

void __thiscall btConvexHullInternal::Rational128::Rational128(Rational128 *this,int64_t value)

{
  if (value < 1) {
    if (-1 < value) {
      this->sign = 0;
      (this->numerator).low = 0;
      (this->numerator).high = 0;
      goto LAB_0012a44a;
    }
    this->sign = -1;
    value = -value;
  }
  else {
    this->sign = 1;
  }
  (this->numerator).low = value;
  (this->numerator).high = 0;
LAB_0012a44a:
  (this->denominator).low = 1;
  (this->denominator).high = 0;
  this->isInt64 = true;
  return;
}

Assistant:

Rational128(int64_t value)
				{
					if (value > 0)
					{
						sign = 1;
						this->numerator = value;
					}
					else if (value < 0)
					{
						sign = -1;
						this->numerator = -value;
					}
					else
					{
						sign = 0;
						this->numerator = (uint64_t) 0;
					}
					this->denominator = (uint64_t) 1;
					isInt64 = true;
				}